

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O0

void parminstall(Symbol *n,char *num,char *units,char *limits)

{
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  char buf [8192];
  Symbol *in_stack_ffffffffffffdfd8;
  List *in_stack_ffffffffffffdfe0;
  
  previous_subtype = *(long *)(in_RDI + 8);
  previous_str = *(char **)(in_RDI + 0x28);
  if (*(long *)(in_RDI + 0x28) == 0) {
    lappendsym(in_stack_ffffffffffffdfe0,in_stack_ffffffffffffdfd8);
  }
  *(ulong *)(in_RDI + 8) = *(ulong *)(in_RDI + 8) | 2;
  sprintf(&stack0xffffffffffffdfd8,"\n%s\n%s\n%s\n",in_RSI,in_RDX,in_RCX);
  pcVar1 = stralloc((char *)in_stack_ffffffffffffdfe0,(char *)in_stack_ffffffffffffdfd8);
  *(char **)(in_RDI + 0x28) = pcVar1;
  return;
}

Assistant:

void parminstall(n, num, units, limits)
	Symbol         *n;
	char           *num, *units, *limits;
{
	char buf[NRN_BUFSIZE];

	previous_subtype = n->subtype;	
	previous_str = n->u.str;
	if (n->u.str == (char *) 0)
		Lappendsym(syminorder, n);
	n->subtype |= PARM;
	Sprintf(buf, "\n%s\n%s\n%s\n", num, units, limits);
	n->u.str = stralloc(buf, (char *) 0);
}